

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperture_solver.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  string *psVar1;
  string *psVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  Station *pSVar6;
  double dVar7;
  bool bVar8;
  uint uVar9;
  char cVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long *plVar23;
  char *pcVar24;
  ostream *poVar25;
  ApertureILS *this;
  ILS *this_00;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__x;
  byte bVar26;
  uint uVar27;
  size_type *psVar28;
  int n;
  int n_00;
  ulong uVar29;
  long lVar30;
  int i;
  char *pcVar31;
  byte search_intensity;
  byte bVar32;
  _List_node_base *p_Var33;
  byte search_aperture;
  byte bVar34;
  uint __len;
  undefined4 uVar35;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar36;
  undefined4 extraout_XMM0_Db;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  initializer_list<args::EitherFlag> in_03;
  initializer_list<args::EitherFlag> in_04;
  initializer_list<args::EitherFlag> in_05;
  initializer_list<args::EitherFlag> in_06;
  initializer_list<args::EitherFlag> in_07;
  initializer_list<args::EitherFlag> in_08;
  initializer_list<args::EitherFlag> in_09;
  initializer_list<args::EitherFlag> in_10;
  initializer_list<args::EitherFlag> in_11;
  initializer_list<args::EitherFlag> in_12;
  initializer_list<args::EitherFlag> in_13;
  initializer_list<args::EitherFlag> in_14;
  initializer_list<args::EitherFlag> in_15;
  initializer_list<args::EitherFlag> in_16;
  initializer_list<args::EitherFlag> in_17;
  initializer_list<args::EitherFlag> in_18;
  initializer_list<args::EitherFlag> in_19;
  initializer_list<args::EitherFlag> in_20;
  initializer_list<args::EitherFlag> in_21;
  initializer_list<args::EitherFlag> in_22;
  initializer_list<args::EitherFlag> in_23;
  initializer_list<args::EitherFlag> in_24;
  initializer_list<args::EitherFlag> in_25;
  initializer_list<args::EitherFlag> in_26;
  initializer_list<args::EitherFlag> in_27;
  initializer_list<args::EitherFlag> in_28;
  initializer_list<args::EitherFlag> in_29;
  initializer_list<args::EitherFlag> in_30;
  initializer_list<args::EitherFlag> in_31;
  initializer_list<args::EitherFlag> in_32;
  initializer_list<args::EitherFlag> in_33;
  initializer_list<args::EitherFlag> in_34;
  initializer_list<args::EitherFlag> in_35;
  initializer_list<args::EitherFlag> in_36;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  string strategy;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file2;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file3;
  Collimator collimator;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _path;
  IntensityGenerator intgen;
  string file;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  string file2;
  set<int,_std::less<int>,_std::allocator<int>_> l;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  string path;
  vector<double,_std::allocator<double>_> Zmax;
  vector<double,_std::allocator<double>_> Zmin;
  vector<double,_std::allocator<double>_> w;
  Plan P;
  string s;
  Group dao_ls;
  ArgumentParser parser;
  Group setup;
  Flag _plot;
  ValueFlag<double,_args::ValueReader<double>_> _alpha;
  ValueFlag<double,_args::ValueReader<double>_> _prob_intensity;
  Group accept;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _strategy;
  ValueFlag<double,_args::ValueReader<double>_> _alphaT;
  ValueFlag<double,_args::ValueReader<double>_> _temperature;
  ValueFlag<double,_args::ValueReader<double>_> _beta;
  Flag ls_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _perturbation;
  ValueFlag<int,_args::ValueReader<int>_> _step_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _max_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _initial_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _open_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _max_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _seed;
  ValueFlag<int,_args::ValueReader<int>_> _maxtime;
  ValueFlag<int,_args::ValueReader<int>_> _maxiter;
  ValueFlag<int,_args::ValueReader<int>_> _vsize;
  ValueFlag<int,_args::ValueReader<int>_> _bsize;
  Flag accept_sa;
  Flag accept_best;
  Flag do_perturbate;
  Flag first_improv;
  Flag best_improv;
  Flag ls_aperture;
  Flag _targeted_search;
  Flag all_rand;
  Flag closed_max;
  Flag closed_min;
  Flag open_min;
  Flag open_max;
  HelpFlag help;
  ValueFlag<int,_args::ValueReader<int>_> _maxratio;
  ValueFlag<int,_args::ValueReader<int>_> _maxdelta;
  int local_2958;
  int local_2950;
  byte local_2948;
  byte local_2944;
  uint local_2938;
  int local_2930;
  int local_292c;
  int local_2928;
  int local_2924;
  int local_2918;
  int local_2914;
  char *local_2910;
  long local_2908;
  char local_2900 [16];
  undefined1 local_28f0 [240];
  int local_2800;
  int local_27fc;
  undefined1 local_27f8 [200];
  _Alloc_hider local_2730;
  undefined1 local_2708 [56];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_26d0 [6];
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2550;
  undefined1 local_2460 [240];
  double local_2370;
  _func_int **local_2368;
  double local_2360;
  undefined1 local_2358 [16];
  undefined1 local_2348 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2340;
  undefined2 local_2330;
  undefined1 *local_2328 [2];
  undefined1 local_2318 [64];
  ios_base local_22d8 [272];
  undefined1 *local_21c8;
  long local_21c0;
  undefined1 local_21b8 [16];
  double local_21a8;
  double local_21a0;
  double local_2198;
  _List_node_base local_2190;
  undefined1 *local_2178;
  long local_2170;
  undefined1 local_2168 [16];
  double local_2158;
  double local_2150;
  double local_2148;
  undefined1 local_2140 [48];
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> local_2110;
  char *local_20f8 [2];
  char local_20e8 [16];
  vector<double,_std::allocator<double>_> local_20d8;
  vector<double,_std::allocator<double>_> local_20c0;
  vector<double,_std::allocator<double>_> local_20a8;
  vector<double,_std::allocator<double>_> local_2090;
  vector<double,_std::allocator<double>_> local_2078;
  vector<double,_std::allocator<double>_> local_2060;
  string local_2048;
  string local_2028;
  string local_2008;
  string local_1fe8;
  string local_1fc8;
  string local_1fa8;
  undefined1 local_1f88 [208];
  char *local_1eb8;
  char local_1ea8 [16];
  Group local_1e98;
  ArgumentParser local_1e30;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1ca0;
  Group local_1c70;
  undefined1 local_1c08 [200];
  ValueFlag<double,_args::ValueReader<double>_> local_1b40;
  ValueFlag<double,_args::ValueReader<double>_> local_1a68;
  Group local_1990;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1928;
  ValueFlag<double,_args::ValueReader<double>_> local_1838;
  ValueFlag<double,_args::ValueReader<double>_> local_1760;
  ValueFlag<double,_args::ValueReader<double>_> local_1688;
  FlagBase local_15b0;
  ValueFlag<int,_args::ValueReader<int>_> local_14e8;
  ValueFlag<int,_args::ValueReader<int>_> local_1418;
  ValueFlag<int,_args::ValueReader<int>_> local_1348;
  ValueFlag<int,_args::ValueReader<int>_> local_1278;
  ValueFlag<int,_args::ValueReader<int>_> local_11a8;
  ValueFlag<int,_args::ValueReader<int>_> local_10d8;
  ValueFlag<int,_args::ValueReader<int>_> local_1008;
  ValueFlag<int,_args::ValueReader<int>_> local_f38;
  ValueFlag<int,_args::ValueReader<int>_> local_e68;
  ValueFlag<int,_args::ValueReader<int>_> local_d98;
  ValueFlag<int,_args::ValueReader<int>_> local_cc8;
  FlagBase local_bf8;
  FlagBase local_b30;
  FlagBase local_a68;
  FlagBase local_9a0;
  FlagBase local_8d8;
  FlagBase local_810;
  FlagBase local_748;
  FlagBase local_680;
  FlagBase local_5b8;
  FlagBase local_4f0;
  FlagBase local_428;
  FlagBase local_360;
  FlagBase local_298;
  ValueFlag<int,_args::ValueReader<int>_> local_1d0;
  ValueFlag<int,_args::ValueReader<int>_> local_100;
  
  uVar22 = time((time_t *)0x0);
  local_2938 = (uint)uVar22;
  local_2910 = local_2900;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2910,"dao_ls","");
  local_21c8 = local_21b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_21c8,"data/testinstance_0_70_140_210_280.txt","");
  local_2178 = local_2168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2178,"data/test_instance_coordinates.txt","");
  local_20f8[0] = local_20e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_20f8,".","");
  local_2708._0_8_ = local_2708 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2708,"********* IMRT-Solver (Aperture solver) *********","");
  local_2358._0_8_ = local_2348;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2358,
             "Example.\n./AS -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt"
             ,"");
  args::ArgumentParser::ArgumentParser(&local_1e30,(string *)local_2708,(string *)local_2358);
  if ((undefined1 *)local_2358._0_8_ != local_2348) {
    operator_delete((void *)local_2358._0_8_);
  }
  if ((undefined1 *)local_2708._0_8_ != local_2708 + 0x10) {
    operator_delete((void *)local_2708._0_8_);
  }
  psVar1 = &local_1928.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  local_1928.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1928,"help","");
  psVar2 = &local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"Display this help menu","")
  ;
  local_2358._0_2_ = 0x6801;
  local_2348 = (undefined1  [8])0x0;
  aStack_2340._0_8_ = aStack_2340._0_8_ & 0xffffffffffffff00;
  local_2330 = 0;
  local_2328[0] = local_2318;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2328,"help","");
  in._M_len = 2;
  in._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in);
  args::Flag::Flag((Flag *)&local_298,&local_1e30.super_Group,(string *)&local_1928,
                   (string *)&local_2550,(Matcher *)local_2708,false);
  local_298.super_NamedBase.super_Base._vptr_Base = (_func_int **)&PTR__FlagBase_0013d758;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  lVar30 = 0;
  do {
    if (local_2318 + lVar30 != *(undefined1 **)((long)local_2328 + lVar30)) {
      operator_delete(*(undefined1 **)((long)local_2328 + lVar30));
    }
    lVar30 = lVar30 + -0x28;
  } while (lVar30 != -0x50);
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_1928.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar1) {
    operator_delete(local_1928.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"string","");
  pcVar3 = local_28f0 + 0x10;
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_28f0,"Strategy  (dao_ls|ibo_ls)","");
  local_2358._0_2_ = 0x7301;
  local_2348 = (undefined1  [8])0x0;
  aStack_2340._0_8_ = aStack_2340._0_8_ & 0xffffffffffffff00;
  local_2330 = 0;
  local_2358._8_8_ = &aStack_2340;
  local_2328[0] = local_2318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2328,"strategy","");
  in_00._M_len = 2;
  in_00._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_00);
  pcVar4 = local_27f8 + 0x10;
  local_27f8._8_8_ = 0;
  local_27f8._16_8_ = local_27f8._16_8_ & 0xffffffffffffff00;
  local_27f8._0_8_ = pcVar4;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&local_1928,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
              (Matcher *)local_2708,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_27f8,false)
  ;
  if ((pointer)local_27f8._0_8_ != pcVar4) {
    operator_delete((void *)local_27f8._0_8_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  lVar30 = 0;
  do {
    if (local_2318 + lVar30 != *(undefined1 **)((long)local_2328 + lVar30)) {
      operator_delete(*(undefined1 **)((long)local_2328 + lVar30));
    }
    lVar30 = lVar30 + -0x28;
  } while (lVar30 != -0x50);
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"int","");
  pcVar24 = local_2460 + 0x10;
  local_2460._0_8_ = pcVar24;
  std::__cxx11::string::_M_construct((ulong)local_2460,'\x02');
  *(undefined2 *)local_2460._0_8_ = 0x3032;
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e2ca);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
    local_27f8._0_8_ = pcVar4;
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"bsize","");
  in_01._M_len = 1;
  in_01._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_01);
  local_1b40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_cc8,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(int *)&local_1b40,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((pointer)local_27f8._0_8_ != pcVar4) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((char *)local_2460._0_8_ != pcVar24) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"int","");
  local_2460._0_8_ = pcVar24;
  std::__cxx11::string::_M_construct((ulong)local_2460,'\x02');
  *(undefined2 *)local_2460._0_8_ = 0x3035;
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e2fe);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
    local_27f8._0_8_ = pcVar4;
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"vsize","");
  in_02._M_len = 1;
  in_02._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_02);
  local_1b40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_d98,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(int *)&local_1b40,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((pointer)local_27f8._0_8_ != pcVar4) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((char *)local_2460._0_8_ != pcVar24) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"int","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2460,
             vsnprintf,0x148,"%f",0);
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e328);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
    local_27f8._0_8_ = pcVar4;
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"maxdelta","");
  in_03._M_len = 1;
  in_03._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_03);
  local_1b40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_100,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(int *)&local_1b40,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((pointer)local_27f8._0_8_ != pcVar4) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((char *)local_2460._0_8_ != pcVar24) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"int","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2460,
             vsnprintf,0x148,"%f",0);
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e33e);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
    local_27f8._0_8_ = pcVar4;
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"maxratio","");
  in_04._M_len = 1;
  in_04._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_04);
  local_1b40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_1d0,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(int *)&local_1b40,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((pointer)local_27f8._0_8_ != pcVar4) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((char *)local_2460._0_8_ != pcVar24) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"int","");
  local_2460._0_8_ = pcVar24;
  std::__cxx11::string::_M_construct((ulong)local_2460,'\x04');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2460._0_8_,4,5000);
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e354);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
    local_27f8._0_8_ = pcVar4;
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"maxiter","");
  in_05._M_len = 1;
  in_05._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_05);
  local_1b40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_e68,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(int *)&local_1b40,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((pointer)local_27f8._0_8_ != pcVar4) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((char *)local_2460._0_8_ != pcVar24) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"int","");
  local_2460._0_8_ = pcVar24;
  std::__cxx11::string::_M_construct((ulong)local_2460,'\x01');
  *(char *)local_2460._0_8_ = '0';
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e373);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
    local_27f8._0_8_ = pcVar4;
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"maxtime","");
  in_06._M_len = 1;
  in_06._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_06);
  local_1b40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_f38,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(int *)&local_1b40,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((pointer)local_27f8._0_8_ != pcVar4) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((char *)local_2460._0_8_ != pcVar24) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"int","");
  uVar19 = -local_2938;
  if (0 < (int)local_2938) {
    uVar19 = local_2938;
  }
  __len = 1;
  if (9 < uVar19) {
    uVar29 = (ulong)uVar19;
    uVar9 = 4;
    do {
      __len = uVar9;
      uVar27 = (uint)uVar29;
      if (uVar27 < 100) {
        __len = __len - 2;
        goto LAB_00107715;
      }
      if (uVar27 < 1000) {
        __len = __len - 1;
        goto LAB_00107715;
      }
      if (uVar27 < 10000) goto LAB_00107715;
      uVar29 = uVar29 / 10000;
      uVar9 = __len + 4;
    } while (99999 < uVar27);
    __len = __len + 1;
  }
LAB_00107715:
  local_2460._0_8_ = local_2460 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_2460,(char)__len - ((char)(uVar22 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_2460._0_8_ + (uVar22 >> 0x1f & 1)),__len,uVar19);
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e395);
  pcVar4 = local_27f8 + 0x10;
  psVar28 = (size_type *)(plVar23 + 2);
  pcVar5 = local_2460 + 0x10;
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
    local_27f8._0_8_ = pcVar4;
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"seed","");
  in_07._M_len = 1;
  in_07._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_07);
  local_1b40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_1008,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(int *)&local_1b40,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((pointer)local_27f8._0_8_ != pcVar4) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((pointer)local_2460._0_8_ != pcVar5) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"double","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2460,
             vsnprintf,0x148,"%f",0);
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e3a9);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
    local_27f8._0_8_ = pcVar4;
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"alpha","");
  in_08._M_len = 1;
  in_08._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_08);
  local_1688.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&local_1b40,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(double *)&local_1688,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((pointer)local_27f8._0_8_ != pcVar4) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((pointer)local_2460._0_8_ != pcVar5) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"double","");
  local_21a0 = 1.0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2460,
             vsnprintf,0x148,"%f");
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e3d6);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
    local_27f8._0_8_ = pcVar4;
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"beta","");
  in_09._M_len = 1;
  in_09._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_09);
  local_1a68.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&local_1688,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(double *)&local_1a68,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((pointer)local_27f8._0_8_ != pcVar4) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((pointer)local_2460._0_8_ != pcVar5) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2708._0_8_ = local_2708 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2708,
             "Initial solution setup (these override all provided configurations):","");
  local_2358._8_8_ = (pointer)0x0;
  local_2358._0_8_ = args::Group::Validators::DontCare;
  aStack_2340._0_8_ =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_invoke;
  local_2348 = (undefined1  [8])
               std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
               _M_manager;
  args::Group::Group(&local_1c70,&local_1e30.super_Group,(string *)local_2708,
                     (function<bool_(const_args::Group_&)> *)local_2358);
  if (local_2348 != (undefined1  [8])0x0) {
    (*(code *)local_2348)(local_2358,local_2358,3);
  }
  if ((undefined1 *)local_2708._0_8_ != local_2708 + 0x10) {
    operator_delete((void *)local_2708._0_8_);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"open_max","");
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_28f0,"Open aperture setup with max intensity","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"open-max-setup","");
  in_10._M_len = 1;
  in_10._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_10);
  args::Flag::Flag((Flag *)&local_360,&local_1c70,(string *)&local_2550,(string *)local_28f0,
                   (Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"open_min","");
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_28f0,"Open aperture setup with min intensity","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"open-min-setup","");
  in_11._M_len = 1;
  in_11._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_11);
  args::Flag::Flag((Flag *)&local_428,&local_1c70,(string *)&local_2550,(string *)local_28f0,
                   (Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"closed_min","");
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_28f0,"Closed aperture setup with min intensity","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"closed-min-setup","");
  in_12._M_len = 1;
  in_12._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_12);
  args::Flag::Flag((Flag *)&local_4f0,&local_1c70,(string *)&local_2550,(string *)local_28f0,
                   (Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"closed_max","");
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_28f0,"Closed aperture setup with max intensity","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"closed-max-setup","");
  in_13._M_len = 1;
  in_13._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_13);
  args::Flag::Flag((Flag *)&local_5b8,&local_1c70,(string *)&local_2550,(string *)local_28f0,
                   (Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"all_rand","");
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_28f0,"Random aperture setup with random intensity","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"rand-setup","");
  in_14._M_len = 1;
  in_14._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_14);
  args::Flag::Flag((Flag *)&local_680,&local_1c70,(string *)&local_2550,(string *)local_28f0,
                   (Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"int","");
  local_2460._0_8_ = local_2460 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_2460,'\x01');
  *(char *)local_2460._0_8_ = '5';
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e589);
  local_27f8._0_8_ = local_27f8 + 0x10;
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"max-apertures","");
  in_15._M_len = 1;
  in_15._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_15);
  local_1a68.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1a68.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_10d8,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(int *)&local_1a68,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((undefined1 *)local_27f8._0_8_ != local_27f8 + 0x10) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((undefined1 *)local_2460._0_8_ != local_2460 + 0x10) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"int","");
  local_2460._0_8_ = local_2460 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_2460,'\x02');
  *(char *)(local_2460._0_8_ + 1) = '1';
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e5bc);
  local_27f8._0_8_ = local_27f8 + 0x10;
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"open-apertures","");
  in_16._M_len = 1;
  in_16._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_16);
  local_1a68.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1a68.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_11a8,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(int *)&local_1a68,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((undefined1 *)local_27f8._0_8_ != local_27f8 + 0x10) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((undefined1 *)local_2460._0_8_ != local_2460 + 0x10) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"int","");
  local_2460._0_8_ = local_2460 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_2460,'\x01');
  *(char *)local_2460._0_8_ = '2';
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e603);
  local_27f8._0_8_ = local_27f8 + 0x10;
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"initial-intensity","")
  ;
  in_17._M_len = 1;
  in_17._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_17);
  local_1a68.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1a68.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_1278,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(int *)&local_1a68,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((undefined1 *)local_27f8._0_8_ != local_27f8 + 0x10) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((undefined1 *)local_2460._0_8_ != local_2460 + 0x10) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"int","");
  local_2460._0_8_ = local_2460 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_2460,'\x02');
  *(undefined2 *)local_2460._0_8_ = 0x3832;
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e639);
  local_27f8._0_8_ = local_27f8 + 0x10;
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"max-intensity","");
  in_18._M_len = 1;
  in_18._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_18);
  local_1a68.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1a68.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_1348,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(int *)&local_1a68,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((undefined1 *)local_27f8._0_8_ != local_27f8 + 0x10) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((undefined1 *)local_2460._0_8_ != local_2460 + 0x10) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"int","");
  local_2460._0_8_ = local_2460 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_2460,'\x01');
  *(char *)local_2460._0_8_ = '2';
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e667);
  local_27f8._0_8_ = local_27f8 + 0x10;
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"step-intensity","");
  in_19._M_len = 1;
  in_19._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_19);
  local_1a68.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1a68.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_1418,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(int *)&local_1a68,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((undefined1 *)local_27f8._0_8_ != local_27f8 + 0x10) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((undefined1 *)local_2460._0_8_ != local_2460 + 0x10) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2708._0_8_ = local_2708 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2708,"Direct aperture local search:","");
  local_2358._8_8_ = (pointer)0x0;
  local_2358._0_8_ = args::Group::Validators::DontCare;
  aStack_2340._0_8_ =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_invoke;
  local_2348 = (undefined1  [8])
               std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
               _M_manager;
  args::Group::Group(&local_1e98,&local_1e30.super_Group,(string *)local_2708,
                     (function<bool_(const_args::Group_&)> *)local_2358);
  pcVar4 = local_2460 + 0x10;
  if (local_2348 != (undefined1  [8])0x0) {
    (*(code *)local_2348)(local_2358,local_2358,3);
  }
  if ((undefined1 *)local_2708._0_8_ != local_2708 + 0x10) {
    operator_delete((void *)local_2708._0_8_);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"targeted_search","");
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_28f0,"Apply targeted local search","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"targeted","");
  in_20._M_len = 1;
  in_20._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_20);
  args::Flag::Flag((Flag *)&local_748,&local_1e98,(string *)&local_2550,(string *)local_28f0,
                   (Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"ls_apertures","");
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_28f0,"Apply aperture local search","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"ls-aperture","");
  in_21._M_len = 1;
  in_21._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_21);
  args::Flag::Flag((Flag *)&local_810,&local_1e98,(string *)&local_2550,(string *)local_28f0,
                   (Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"ls_intensity","");
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_28f0,"Apply intensity local search","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"ls-intensity","");
  in_22._M_len = 1;
  in_22._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_22);
  args::Flag::Flag((Flag *)&local_15b0,&local_1e98,(string *)&local_2550,(string *)local_28f0,
                   (Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"double","");
  local_2360 = 0.2;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2460,
             vsnprintf,0x148,"%f");
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e759);
  local_27f8._0_8_ = local_27f8 + 0x10;
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"prob-intensity","");
  in_23._M_len = 1;
  in_23._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_23);
  local_1760.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&local_1a68,&local_1e98,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(double *)&local_1760,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((undefined1 *)local_27f8._0_8_ != local_27f8 + 0x10) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((pointer)local_2460._0_8_ != pcVar4) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"best_improv","");
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_28f0,"Apply best improvement when searching intensity or apertures","")
  ;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"best-improvement","");
  in_24._M_len = 1;
  in_24._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_24);
  args::Flag::Flag((Flag *)&local_8d8,&local_1e98,(string *)&local_2550,(string *)local_28f0,
                   (Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"first_improv","");
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_28f0,"Apply first improvement when searching intensity or apertures",""
            );
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"first-improvement","")
  ;
  in_25._M_len = 1;
  in_25._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_25);
  args::Flag::Flag((Flag *)&local_9a0,&local_1e98,(string *)&local_2550,(string *)local_28f0,
                   (Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"do_perturbate","");
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_28f0,"Perturbate after a selected criterion is triggered","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"perturbate","");
  in_26._M_len = 1;
  in_26._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_26);
  args::Flag::Flag((Flag *)&local_a68,&local_1e98,(string *)&local_2550,(string *)local_28f0,
                   (Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"int","");
  local_2460._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct((ulong)local_2460,'\x01');
  *(char *)local_2460._0_8_ = '2';
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e888);
  local_27f8._0_8_ = local_27f8 + 0x10;
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"perturbation-size","")
  ;
  in_27._M_len = 1;
  in_27._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_27);
  local_1760.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1760.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_14e8,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(int *)&local_1760,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((undefined1 *)local_27f8._0_8_ != local_27f8 + 0x10) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((pointer)local_2460._0_8_ != pcVar4) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2708._0_8_ = local_2708 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2708,"Acceptance criterion:","");
  local_2358._8_8_ = (pointer)0x0;
  local_2358._0_8_ = args::Group::Validators::AtMostOne;
  aStack_2340._0_8_ =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_invoke;
  local_2348 = (undefined1  [8])
               std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
               _M_manager;
  args::Group::Group(&local_1990,&local_1e30.super_Group,(string *)local_2708,
                     (function<bool_(const_args::Group_&)> *)local_2358);
  if (local_2348 != (undefined1  [8])0x0) {
    (*(code *)local_2348)(local_2358,local_2358,3);
  }
  if ((undefined1 *)local_2708._0_8_ != local_2708 + 0x10) {
    operator_delete((void *)local_2708._0_8_);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"accept-best","");
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_28f0,"Accept only improvement","")
  ;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"accept-best","");
  in_28._M_len = 1;
  in_28._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_28);
  args::Flag::Flag((Flag *)&local_b30,&local_1990,(string *)&local_2550,(string *)local_28f0,
                   (Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"accept-sa","");
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_28f0,"Accept as simulated annealing","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"accept-sa","");
  in_29._M_len = 1;
  in_29._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_29);
  args::Flag::Flag((Flag *)&local_bf8,&local_1990,(string *)&local_2550,(string *)local_28f0,
                   (Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"double","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2460,
             vsnprintf,0x148,"%f");
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e911);
  local_27f8._0_8_ = local_27f8 + 0x10;
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"temperature","");
  in_30._M_len = 1;
  in_30._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_30);
  local_1838.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&local_1760,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(double *)&local_1838,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((undefined1 *)local_27f8._0_8_ != local_27f8 + 0x10) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((pointer)local_2460._0_8_ != pcVar4) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2550,"double","");
  local_2198 = 0.95;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2460,
             vsnprintf,0x148,"%f");
  plVar23 = (long *)std::__cxx11::string::replace((ulong)local_2460,0,(char *)0x0,0x12e945);
  local_27f8._0_8_ = local_27f8 + 0x10;
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_27f8._16_8_ = *psVar28;
    local_27f8._24_8_ = plVar23[3];
  }
  else {
    local_27f8._16_8_ = *psVar28;
    local_27f8._0_8_ = (size_type *)*plVar23;
  }
  local_27f8._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append(local_27f8);
  psVar28 = (size_type *)(plVar23 + 2);
  if ((size_type *)*plVar23 == psVar28) {
    local_28f0._16_8_ = *psVar28;
    local_28f0._24_4_ = (undefined4)plVar23[3];
    local_28f0._28_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
    local_28f0._0_8_ = pcVar3;
  }
  else {
    local_28f0._16_8_ = *psVar28;
    local_28f0._0_8_ = (size_type *)*plVar23;
  }
  local_28f0._8_8_ = plVar23[1];
  *plVar23 = (long)psVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"alphaT","");
  in_31._M_len = 1;
  in_31._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_31);
  local_1f88._0_8_ = (pointer)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&local_1838,&local_1e30.super_Group,(string *)&local_2550,(string *)local_28f0,
             (Matcher *)local_2708,(double *)local_1f88,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  if ((undefined1 *)local_27f8._0_8_ != local_27f8 + 0x10) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((pointer)local_2460._0_8_ != pcVar4) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((string *)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_28f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_28f0,"string","");
  local_27f8._0_8_ = local_27f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_27f8,"File with the deposition matrix","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"file-dep","");
  in_32._M_len = 1;
  in_32._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_32);
  local_2460._8_8_ = 0;
  local_2460[0x10] = '\0';
  local_2460._0_8_ = pcVar4;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&local_2550,&local_1e30.super_Group,(string *)local_28f0,(string *)local_27f8,
              (Matcher *)local_2708,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2460,false)
  ;
  if ((pointer)local_2460._0_8_ != pcVar4) {
    operator_delete((void *)local_2460._0_8_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((undefined1 *)local_27f8._0_8_ != local_27f8 + 0x10) {
    operator_delete((void *)local_27f8._0_8_);
  }
  if ((pointer)local_28f0._0_8_ != pcVar3) {
    operator_delete((void *)local_28f0._0_8_);
  }
  local_27f8._0_8_ = local_27f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_27f8,"string","");
  local_2460._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2460,"File with the beam coordinates","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"file-coord","");
  in_33._M_len = 1;
  in_33._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_33);
  pcVar3 = local_1f88 + 0x10;
  local_1f88._8_8_ = 0;
  local_1f88[0x10] = '\0';
  local_1f88._0_8_ = pcVar3;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_28f0,&local_1e30.super_Group,(string *)local_27f8,(string *)local_2460,
              (Matcher *)local_2708,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f88,false)
  ;
  if ((pointer)local_1f88._0_8_ != pcVar3) {
    operator_delete((void *)local_1f88._0_8_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_2460._0_8_ != pcVar4) {
    operator_delete((void *)local_2460._0_8_);
  }
  if ((undefined1 *)local_27f8._0_8_ != local_27f8 + 0x10) {
    operator_delete((void *)local_27f8._0_8_);
  }
  local_2460._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2460,"string","");
  local_1f88._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f88,"File with initial intensities","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"file-sol","");
  in_34._M_len = 1;
  in_34._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_34);
  pcVar5 = local_1c08 + 0x10;
  local_1c08._8_8_ = 0;
  local_1c08[0x10] = '\0';
  local_1c08._0_8_ = pcVar5;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_27f8,&local_1e30.super_Group,(string *)local_2460,(string *)local_1f88,
              (Matcher *)local_2708,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c08,false)
  ;
  if ((pointer)local_1c08._0_8_ != pcVar5) {
    operator_delete((void *)local_1c08._0_8_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_1f88._0_8_ != pcVar3) {
    operator_delete((void *)local_1f88._0_8_);
  }
  if ((pointer)local_2460._0_8_ != pcVar4) {
    operator_delete((void *)local_2460._0_8_);
  }
  local_1f88._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f88,"string","");
  local_1c08._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c08,
             "Absolute path of the executable (if it is executed from other directory)","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"path","");
  in_35._M_len = 1;
  in_35._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_35);
  pcVar4 = local_2140 + 0x10;
  local_2140._8_8_ = 0;
  local_2140[0x10] = '\0';
  local_2140._0_8_ = pcVar4;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2460,&local_1e30.super_Group,(string *)local_1f88,(string *)local_1c08,
              (Matcher *)local_2708,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2140,false)
  ;
  if ((pointer)local_2140._0_8_ != pcVar4) {
    operator_delete((void *)local_2140._0_8_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_1c08._0_8_ != pcVar5) {
    operator_delete((void *)local_1c08._0_8_);
  }
  if ((pointer)local_1f88._0_8_ != pcVar3) {
    operator_delete((void *)local_1f88._0_8_);
  }
  local_1f88._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f88,"bool","");
  local_2140._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2140,"Generate plot and save in file","");
  local_2358._0_8_ = local_2358._0_8_ & 0xffffffffffff0000;
  local_2358._8_8_ = &aStack_2340;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2358 + 8),"plot","");
  in_36._M_len = 1;
  in_36._M_array = (iterator)local_2358;
  args::Matcher::Matcher((Matcher *)local_2708,in_36);
  args::Flag::Flag((Flag *)local_1c08,&local_1e30.super_Group,(string *)local_1f88,
                   (string *)local_2140,(Matcher *)local_2708,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_26d0);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2358._8_8_ != &aStack_2340) {
    operator_delete((void *)local_2358._8_8_);
  }
  if ((pointer)local_2140._0_8_ != pcVar4) {
    operator_delete((void *)local_2140._0_8_);
  }
  if ((pointer)local_1f88._0_8_ != pcVar3) {
    operator_delete((void *)local_1f88._0_8_);
  }
  args::ArgumentParser::ParseCLI(&local_1e30,argc,argv);
  cVar10 = (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_1928.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base + 0x10))->_M_allocated_capacity)();
  if (cVar10 != '\0') {
    std::__cxx11::string::_M_assign((string *)&local_2910);
  }
  iVar12 = (*local_cc8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  iVar18 = 0x14;
  if ((char)iVar12 != '\0') {
    iVar18 = local_cc8.value;
  }
  iVar13 = (*local_d98.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  iVar12 = 0x32;
  if ((char)iVar13 != '\0') {
    iVar12 = local_d98.value;
  }
  iVar13 = (*local_100.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     (&local_100);
  local_2370 = (double)local_100.value;
  iVar14 = (*local_1d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     (&local_1d0);
  local_21a8 = (double)local_1d0.value;
  iVar15 = (*local_e68.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  local_2924 = 5000;
  if ((char)iVar15 != '\0') {
    local_2924 = local_e68.value;
  }
  iVar15 = (*local_f38.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  local_2930 = 0;
  if ((char)iVar15 != '\0') {
    local_2930 = local_f38.value;
  }
  iVar15 = (*local_1008.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  if ((char)iVar15 != '\0') {
    local_2938 = local_1008.value;
  }
  cVar10 = (**(code **)(CONCAT44(local_1b40.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                 super_Base._vptr_Base._4_4_,
                                 local_1b40.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                 super_Base._vptr_Base._0_4_) + 0x10))();
  if (cVar10 == '\0') {
    uVar35 = 0;
    uVar36 = 0x3ff00000;
  }
  else {
    uVar35 = SUB84(local_1b40.value,0);
    uVar36 = (undefined4)((ulong)local_1b40.value >> 0x20);
  }
  local_2368 = (_func_int **)CONCAT44(uVar36,uVar35);
  iVar15 = (*local_1688.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  if ((char)iVar15 != '\0') {
    local_21a0 = local_1688.value;
  }
  iVar15 = (*local_10d8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  local_2914 = 5;
  if ((char)iVar15 != '\0') {
    local_2914 = local_10d8.value;
  }
  iVar15 = (*local_11a8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  local_2918 = -1;
  if ((char)iVar15 != '\0') {
    local_2918 = local_11a8.value;
  }
  iVar16 = (*local_1278.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  iVar15 = 2;
  if ((char)iVar16 != '\0') {
    iVar15 = local_1278.value;
  }
  iVar16 = (*local_1348.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  local_292c = 0x1c;
  if ((char)iVar16 != '\0') {
    local_292c = local_1348.value;
  }
  iVar17 = (*local_1418.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  iVar16 = 2;
  if ((char)iVar17 != '\0') {
    iVar16 = local_1418.value;
  }
  iVar17 = (*local_1a68.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  if ((char)iVar17 != '\0') {
    local_2360 = local_1a68.value;
  }
  local_27fc = iVar18;
  iVar18 = (*local_748.super_NamedBase.super_Base._vptr_Base[2])();
  iVar17 = (*local_810.super_NamedBase.super_Base._vptr_Base[2])(&local_810);
  search_aperture = (byte)iVar17;
  iVar17 = (*local_15b0.super_NamedBase.super_Base._vptr_Base[2])();
  search_intensity = (byte)iVar17;
  iVar17 = (*local_810.super_NamedBase.super_Base._vptr_Base[2])(&local_810);
  if ((char)iVar17 == '\0') {
    iVar17 = (*local_15b0.super_NamedBase.super_Base._vptr_Base[2])();
    bVar11 = (byte)iVar17 ^ 1;
    search_aperture = search_aperture | bVar11;
    search_intensity = search_intensity | bVar11;
  }
  iVar17 = (*local_14e8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  local_2928 = 2;
  if ((char)iVar17 != '\0') {
    local_2928 = local_14e8.value;
  }
  (*local_9a0.super_NamedBase.super_Base._vptr_Base[2])();
  uVar19 = (*local_8d8.super_NamedBase.super_Base._vptr_Base[2])();
  iVar17 = (*local_bf8.super_NamedBase.super_Base._vptr_Base[2])();
  iVar20 = (*local_b30.super_NamedBase.super_Base._vptr_Base[2])();
  iVar21 = (*local_1760.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     (&local_1760);
  uVar35 = SUB84(local_1760.value,0);
  uVar36 = (undefined4)((ulong)local_1760.value >> 0x20);
  local_2148 = local_1760.value;
  if ((char)iVar21 == '\0') {
    uVar35 = 0;
    uVar36 = 0x40240000;
  }
  local_2158 = (double)CONCAT44(uVar36,uVar35);
  iVar21 = (*local_1838.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  if ((char)iVar21 != '\0') {
    local_2198 = local_1838.value;
  }
  iVar21 = (*local_360.super_NamedBase.super_Base._vptr_Base[2])();
  local_2958 = 0;
  bVar11 = (byte)iVar21;
  local_2800 = iVar12;
  if (bVar11 == 0) {
    iVar12 = (*local_428.super_NamedBase.super_Base._vptr_Base[2])();
    if ((char)iVar12 == '\0') {
      iVar12 = (*local_4f0.super_NamedBase.super_Base._vptr_Base[2])();
      if ((char)iVar12 != '\0') {
        local_2950 = 2;
        local_2948 = 1;
        local_2958 = 0;
        bVar34 = 0;
        goto LAB_0010a853;
      }
      iVar12 = (*local_5b8.super_NamedBase.super_Base._vptr_Base[2])();
      if ((char)iVar12 != '\0') {
        local_2950 = 3;
        bVar34 = 1;
        local_2958 = local_292c;
        goto LAB_0010a84b;
      }
      iVar12 = (*local_680.super_NamedBase.super_Base._vptr_Base[2])();
      local_2958 = iVar15;
      if ((char)iVar12 == '\0') {
        local_2950 = 6;
        goto LAB_0010a848;
      }
      iVar12 = std::__cxx11::string::compare((char *)&local_2910);
      if (iVar12 != 0) {
        std::__cxx11::string::compare((char *)&local_2910);
        local_2950 = 5;
        bVar8 = true;
        local_2944 = 0;
        bVar34 = 0;
        local_2948 = 0;
        bVar32 = 0;
        goto LAB_0010a89a;
      }
      local_2950 = 4;
      bVar32 = 1;
      bVar34 = 0;
      local_2948 = 0;
      goto LAB_0010a856;
    }
    local_2944 = 1;
    bVar34 = 0;
    local_2948 = 0;
    bVar32 = 0;
    bVar8 = false;
    local_2950 = 0;
  }
  else {
    local_2950 = 1;
    local_2958 = local_292c;
LAB_0010a848:
    bVar34 = 0;
LAB_0010a84b:
    local_2948 = 0;
LAB_0010a853:
    bVar32 = 0;
LAB_0010a856:
    local_2944 = 0;
    bVar8 = false;
  }
LAB_0010a89a:
  srand(local_2938);
  cVar10 = (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_2550.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base + 0x10))->_M_allocated_capacity)();
  if (cVar10 != '\0') {
    std::__cxx11::string::_M_assign((string *)&local_21c8);
  }
  cVar10 = (**(code **)(local_28f0._0_8_ + 0x10))();
  if (cVar10 != '\0') {
    std::__cxx11::string::_M_assign((string *)&local_2178);
  }
  cVar10 = (**(code **)(local_27f8._0_8_ + 0x10))();
  if (cVar10 == '\0') {
    pcVar24 = (char *)0x0;
  }
  else {
    pcVar24 = strdup(local_2730._M_p);
  }
  cVar10 = (**(code **)(local_2460._0_8_ + 0x10))();
  if (cVar10 != '\0') {
    std::__cxx11::string::_M_assign((string *)local_20f8);
  }
  chdir(local_20f8[0]);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  iVar12 = std::__cxx11::string::compare((char *)&local_2910);
  if (iVar12 == 0) {
    pcVar31 = "##******** IMRT-Solver (Direct Aperture Optimization Local Search) *********";
  }
  else {
    iVar12 = std::__cxx11::string::compare((char *)&local_2910);
    if (iVar12 != 0) goto LAB_0010aa57;
    pcVar31 = "##******** IMRT-Solver (Intensity-based Optimization Local Search) *********";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar31,0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
LAB_0010aa57:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_2708._0_8_ = (pointer)0x3ff0000000000000;
  local_2708._8_8_ = 0x3ff0000000000000;
  local_2708._16_8_ = 0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)local_2708;
  std::vector<double,_std::allocator<double>_>::vector(&local_2060,__l,(allocator_type *)local_2358)
  ;
  local_2708._0_8_ = (pointer)0x0;
  local_2708._8_8_ = 0;
  local_2708._16_8_ = 0x4053000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_2708;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_2078,__l_00,(allocator_type *)local_2358);
  local_2708._0_8_ = (pointer)0x4050400000000000;
  local_2708._8_8_ = 0x404e000000000000;
  local_2708._16_8_ = 0x408f400000000000;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_2708;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_2090,__l_01,(allocator_type *)local_2358);
  local_1fa8._M_dataplus._M_p = (pointer)&local_1fa8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1fa8,local_2178,local_2178 + local_2170);
  local_1fc8._M_dataplus._M_p = (pointer)&local_1fc8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1fc8,local_21c8,local_21c8 + local_21c0);
  get_angles((set<int,_std::less<int>,_std::allocator<int>_> *)&local_1ca0,&local_1fc8,n);
  imrt::Collimator::Collimator
            ((Collimator *)local_2708,&local_1fa8,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&local_1ca0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1ca0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fc8._M_dataplus._M_p != &local_1fc8.field_2) {
    operator_delete(local_1fc8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fa8._M_dataplus._M_p != &local_1fa8.field_2) {
    operator_delete(local_1fa8._M_dataplus._M_p);
  }
  local_1fe8._M_dataplus._M_p = (pointer)&local_1fe8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1fe8,local_21c8,local_21c8 + local_21c0);
  createVolumes(&local_2110,&local_1fe8,(Collimator *)local_2708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fe8._M_dataplus._M_p != &local_1fe8.field_2) {
    operator_delete(local_1fe8._M_dataplus._M_p);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_20a8,&local_2060);
  std::vector<double,_std::allocator<double>_>::vector(&local_20c0,&local_2078);
  std::vector<double,_std::allocator<double>_>::vector(&local_20d8,&local_2090);
  imrt::Plan::Plan((Plan *)local_1f88,&local_20a8,&local_20c0,&local_20d8,(Collimator *)local_2708,
                   &local_2110,local_2914,local_292c,local_2958,iVar16,local_2918,local_2950,pcVar24
                  );
  if (local_20d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_20d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_20c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_20c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_20a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_20a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2150 = imrt::Plan::getEvaluation((Plan *)local_1f88);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  poVar25 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar25,"##**************************************************************************",
             0x4c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##*********************************** INFO *********************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  poVar25 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,"## Solver: ",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Iterations: ",0x11)
  ;
  plVar23 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_2924);
  std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23);
  std::ostream::put((char)plVar23);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Time: ",0xb);
  plVar23 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_2930);
  std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23);
  std::ostream::put((char)plVar23);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Seed: ",0xb);
  plVar23 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_2938);
  std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23);
  std::ostream::put((char)plVar23);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##   Temperature: ",0x12);
  poVar25 = std::ostream::_M_insert<double>(local_2148);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   alpha: ",0xc);
  poVar25 = std::ostream::_M_insert<double>((double)local_2368);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  if ((bool)search_aperture != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"##   Searching: aperture pattern",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  if ((bool)search_intensity != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"##   Searching: intensity",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##   Probability intensity ls: ",0x1f);
  poVar25 = std::ostream::_M_insert<double>(local_2360);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  iVar12 = std::__cxx11::string::compare((char *)&local_2910);
  if (((char)uVar19 == '\0') && (iVar12 == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"##   Local search: first improvement",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  iVar12 = std::__cxx11::string::compare((char *)&local_2910);
  if (((uVar19 & 0xff) != 0) && (iVar12 == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"##   Local search: best improvement",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  iVar12 = std::__cxx11::string::compare((char *)&local_2910);
  if ((char)iVar18 == '\x01' && iVar12 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"##   Targeted search: yes",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  iVar12 = std::__cxx11::string::compare((char *)&local_2910);
  if ((char)iVar18 == '\0' && iVar12 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"##   Targeted search: no",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  plVar23 = &std::cout;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##   Open initial setup: ",0x19);
  bVar34 = bVar34 | bVar11 | local_2944;
  bVar26 = bVar34 | local_2948;
  if ((bVar32 | bVar26) == 1) {
    lVar30 = 6;
    if (bVar26 != 0) {
      lVar30 = (ulong)(byte)((bVar11 | local_2944) ^ 1) * 2 + 0x12;
    }
    pcVar24 = "closed max intensity";
    if (local_2944 != 0) {
      pcVar24 = "open min intensity";
    }
    pcVar31 = "open max intensity";
    if (bVar11 == 0) {
      pcVar31 = pcVar24;
    }
    pcVar24 = "random";
    if (local_2948 != 0) {
      pcVar24 = "closed min intensity";
    }
    if (bVar34 != 0) {
      pcVar24 = pcVar31;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar24,lVar30);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  else {
    if (bVar8) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"random",6);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"manual, ",8);
      plVar23 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_2918);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar23," open apertures",0xf);
    }
    std::endl<char,std::char_traits<char>>((ostream *)plVar23);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##   Initial intensity: ",0x18);
  plVar23 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_2958);
  std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23);
  std::ostream::put((char)plVar23);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##   Max intensity: ",0x14);
  plVar23 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_292c);
  std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23);
  std::ostream::put((char)plVar23);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##   Step intensity: ",0x15);
  plVar23 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar16);
  std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23);
  std::ostream::put((char)plVar23);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##   Perturbation size: ",0x18);
  plVar23 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_2928);
  std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23);
  std::ostream::put((char)plVar23);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  poVar25 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,"## Colimator configuration: ",0x1c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Stations: ",0xf);
  iVar18 = imrt::Collimator::getNbAngles((Collimator *)local_2708);
  plVar23 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar18);
  std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23);
  std::ostream::put((char)plVar23);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Angles: ",0xd);
  for (iVar18 = 0; iVar12 = imrt::Collimator::getNbAngles((Collimator *)local_2708), iVar18 < iVar12
      ; iVar18 = iVar18 + 1) {
    iVar12 = imrt::Collimator::getAngle((Collimator *)local_2708,iVar18);
    poVar25 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar25," ",1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Apertures: ",0x10);
  plVar23 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_2914);
  std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23);
  std::ostream::put((char)plVar23);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  poVar25 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,"## Instance information: ",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Volumes: ",0xe);
  poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  poVar25 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar25,"##**************************************************************************",
             0x4c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##********************************** SEARCH ********************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"## Initial solution: ",0x15);
  poVar25 = std::ostream::_M_insert<double>(local_2150);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  iVar18 = 0;
  do {
    imrt::Plan::printIntensity((Plan *)local_1f88,iVar18);
    iVar18 = iVar18 + 1;
  } while (iVar18 != 5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  iVar18 = std::__cxx11::string::compare((char *)&local_2910);
  if (iVar18 == 0) {
    this = (ApertureILS *)operator_new(0x78);
    iVar18 = (*local_a68.super_NamedBase.super_Base._vptr_Base[2])();
    imrt::ApertureILS::ApertureILS
              (this,local_27fc,local_2800,(bool)search_intensity,(bool)search_aperture,local_2360,
               iVar16,local_2158,local_2198,SUB41(iVar18,0),local_2928,
               (uint)(byte)((byte)iVar17 & ((byte)iVar20 ^ 1)),uVar19 & 0xff);
    imrt::ILS::notTargetedSearch((ILS *)this,(Plan *)local_1f88,local_2930,local_2924);
  }
  else {
    iVar18 = std::__cxx11::string::compare((char *)&local_2910);
    if (iVar18 == 0) {
      this_00 = (ILS *)operator_new(0x60);
      this_00->max_no_improvement = 100.0;
      this_00->bsize = local_27fc;
      this_00->vsize = local_2800;
      this_00->acceptance = 0;
      this_00->_vptr_ILS = (_func_int **)&PTR__ILS_0013dcb0;
      *(int *)&this_00->field_0x24 = iVar16;
      *(int *)&this_00[1]._vptr_ILS = local_2928;
      if ((char)iVar13 == '\0') {
        local_2370 = 5.0;
      }
      this_00[1].max_no_improvement = local_2370;
      if ((char)iVar14 == '\0') {
        local_21a8 = 3.0;
      }
      this_00[1].time_begin = (clock_t)local_21a8;
      *(double *)&this_00[1].bsize = local_2370;
      *(double *)&this_00[1].acceptance = local_21a8;
      this_00[2]._vptr_ILS = local_2368;
      this_00[2].max_no_improvement = local_21a0;
      imrt::ILS::beamTargetedSearch(this_00,(Plan *)local_1f88,local_2930,local_2924);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      iVar18 = 0;
      do {
        imrt::Plan::printIntensity((Plan *)local_1f88,iVar18);
        iVar18 = iVar18 + 1;
      } while (iVar18 != 5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      iVar18 = 0x32;
      do {
        (*this_00->_vptr_ILS[3])(0,this_00,local_1f88,1);
        poVar25 = std::ostream::_M_insert<double>
                            ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
        std::ostream::put((char)poVar25);
        std::ostream::flush();
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
      dVar7 = imrt::Plan::eval((Plan *)local_1f88);
      poVar25 = std::ostream::_M_insert<double>(dVar7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
      std::ostream::put((char)poVar25);
      std::ostream::flush();
    }
    else {
      iVar18 = std::__cxx11::string::compare((char *)&local_2910);
      if (iVar18 == 0) {
        imrt::IntensityGenerator::IntensityGenerator((IntensityGenerator *)local_2358);
        imrt::IntensityGenerator::generate((IntensityGenerator *)local_2358,(Plan *)local_1f88);
        imrt::IntensityGenerator::~IntensityGenerator((IntensityGenerator *)local_2358);
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##******************************* RESULTS **********************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"## Best solution found: ",0x18);
  dVar7 = imrt::Plan::getEvaluation((Plan *)local_1f88);
  poVar25 = std::ostream::_M_insert<double>(dVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  dVar7 = imrt::Plan::getEvaluation((Plan *)local_1f88);
  poVar25 = std::ostream::_M_insert<double>(dVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25," ",1);
  __x = imrt::Plan::get_stations_abi_cxx11_((Plan *)local_1f88);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)&local_2190,__x);
  iVar18 = 0;
  if (local_2190._M_next != &local_2190) {
    p_Var33 = local_2190._M_next;
    do {
      pSVar6 = (Station *)p_Var33[1]._M_next;
      local_2008._M_dataplus._M_p = (pointer)&local_2008.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2008,local_2910,local_2910 + local_2908);
      iVar12 = imrt::Station::get_sum_alpha(pSVar6,&local_2008);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2008._M_dataplus._M_p != &local_2008.field_2) {
        operator_delete(local_2008._M_dataplus._M_p);
      }
      poVar25 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25," ",1);
      iVar18 = iVar18 + iVar12;
      p_Var33 = p_Var33->_M_next;
    } while (p_Var33 != &local_2190);
  }
  poVar25 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25," ",1);
  iVar18 = 0;
  if (local_2190._M_next != &local_2190) {
    p_Var33 = local_2190._M_next;
    do {
      pSVar6 = (Station *)p_Var33[1]._M_next;
      local_2028._M_dataplus._M_p = (pointer)&local_2028.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2028,local_2910,local_2910 + local_2908);
      iVar12 = imrt::Station::get_nb_apertures(pSVar6,&local_2028);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2028._M_dataplus._M_p != &local_2028.field_2) {
        operator_delete(local_2028._M_dataplus._M_p);
      }
      poVar25 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25," ",1);
      iVar18 = iVar18 + iVar12;
      p_Var33 = p_Var33->_M_next;
    } while (p_Var33 != &local_2190);
  }
  plVar23 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar18);
  std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23);
  std::ostream::put((char)plVar23);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  iVar18 = 0;
  do {
    imrt::Plan::printIntensity((Plan *)local_1f88,iVar18);
    iVar18 = iVar18 + 1;
  } while (iVar18 != 5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_2048._M_dataplus._M_p = (pointer)&local_2048.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2048,local_21c8,local_21c8 + local_21c0);
  get_angles((set<int,_std::less<int>,_std::allocator<int>_> *)local_2140,&local_2048,n_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2048._M_dataplus._M_p != &local_2048.field_2) {
    operator_delete(local_2048._M_dataplus._M_p);
  }
  cVar10 = (**(code **)(local_1c08._0_8_ + 0x10))();
  if (cVar10 != '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2358);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2348,"python plotter/plot.py ",0x17);
    poVar25 = (ostream *)
              std::ostream::operator<<((ostream *)local_2348,*(int *)(local_2140._24_8_ + 0x20) / 5)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar25,"_",1);
    poVar25 = std::__ostream_insert<char,std::char_traits<char>>(poVar25,local_2910,local_2908);
    std::__ostream_insert<char,std::char_traits<char>>(poVar25,"_",1);
    poVar25 = (ostream *)std::ostream::operator<<((ostream *)poVar25,local_2958);
    std::__ostream_insert<char,std::char_traits<char>>(poVar25,"_",1);
    poVar25 = (ostream *)std::ostream::operator<<((ostream *)poVar25,local_2950);
    std::__ostream_insert<char,std::char_traits<char>>(poVar25,"_",1);
    poVar25 = (ostream *)std::ostream::operator<<((ostream *)poVar25,local_2930);
    std::__ostream_insert<char,std::char_traits<char>>(poVar25,"_",1);
    poVar25 = (ostream *)std::ostream::operator<<((ostream *)poVar25,local_2938);
    std::__ostream_insert<char,std::char_traits<char>>(poVar25,".pdf",4);
    std::__cxx11::stringbuf::str();
    system(local_1eb8);
    if (local_1eb8 != local_1ea8) {
      operator_delete(local_1eb8);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2358);
    std::ios_base::~ios_base(local_22d8);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_2140);
  while (local_2190._M_next != &local_2190) {
    p_Var33 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
               &(local_2190._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(local_2190._M_next);
    local_2190._M_next = p_Var33;
  }
  imrt::Plan::~Plan((Plan *)local_1f88);
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector(&local_2110);
  imrt::Collimator::~Collimator((Collimator *)local_2708);
  if (local_2090.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_2090.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2078.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_2078.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2060.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_2060.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  args::FlagBase::~FlagBase((FlagBase *)local_1c08);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2460);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_27f8);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_28f0);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&local_2550);
  args::FlagBase::~FlagBase((FlagBase *)&local_1838);
  args::FlagBase::~FlagBase((FlagBase *)&local_1760);
  args::FlagBase::~FlagBase(&local_bf8);
  args::FlagBase::~FlagBase(&local_b30);
  args::Group::~Group(&local_1990);
  args::FlagBase::~FlagBase((FlagBase *)&local_14e8);
  args::FlagBase::~FlagBase(&local_a68);
  args::FlagBase::~FlagBase(&local_9a0);
  args::FlagBase::~FlagBase(&local_8d8);
  args::FlagBase::~FlagBase((FlagBase *)&local_1a68);
  args::FlagBase::~FlagBase(&local_15b0);
  args::FlagBase::~FlagBase(&local_810);
  args::FlagBase::~FlagBase(&local_748);
  args::Group::~Group(&local_1e98);
  args::FlagBase::~FlagBase((FlagBase *)&local_1418);
  args::FlagBase::~FlagBase((FlagBase *)&local_1348);
  args::FlagBase::~FlagBase((FlagBase *)&local_1278);
  args::FlagBase::~FlagBase((FlagBase *)&local_11a8);
  args::FlagBase::~FlagBase((FlagBase *)&local_10d8);
  args::FlagBase::~FlagBase(&local_680);
  args::FlagBase::~FlagBase(&local_5b8);
  args::FlagBase::~FlagBase(&local_4f0);
  args::FlagBase::~FlagBase(&local_428);
  args::FlagBase::~FlagBase(&local_360);
  args::Group::~Group(&local_1c70);
  args::FlagBase::~FlagBase((FlagBase *)&local_1688);
  args::FlagBase::~FlagBase((FlagBase *)&local_1b40);
  args::FlagBase::~FlagBase((FlagBase *)&local_1008);
  args::FlagBase::~FlagBase((FlagBase *)&local_f38);
  args::FlagBase::~FlagBase((FlagBase *)&local_e68);
  args::FlagBase::~FlagBase((FlagBase *)&local_1d0);
  args::FlagBase::~FlagBase((FlagBase *)&local_100);
  args::FlagBase::~FlagBase((FlagBase *)&local_d98);
  args::FlagBase::~FlagBase((FlagBase *)&local_cc8);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&local_1928);
  args::FlagBase::~FlagBase(&local_298);
  args::ArgumentParser::~ArgumentParser(&local_1e30);
  if (local_20f8[0] != local_20e8) {
    operator_delete(local_20f8[0]);
  }
  if (local_2178 != local_2168) {
    operator_delete(local_2178);
  }
  if (local_21c8 != local_21b8) {
    operator_delete(local_21c8);
  }
  if (local_2910 != local_2900) {
    operator_delete(local_2910);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv){

  // Target heuristic
  int vsize = 50;
  int bsize = 20;
  double maxdelta = 5.0;
  double maxratio = 3.0;

  // Budget and execution variables
  int maxiter = 5000;
  int maxtime = 0;
  int seed = time(NULL);

  // Intensity local search parameters
  double alpha = 1.0;
  double beta = 1.0;

  // Aperture and intensity configuration
  int max_apertures = 5;
  int open_apertures = -1;
  int initial_setup;
  int initial_intensity = 2;
  int max_intensity = 28;
  int step_intensity = 2;

  // Type of local search
  string strategy = "dao_ls";
  int ls_type = ApertureILS::FIRST_IMPROVEMENT;
  bool acceptance = ILS::ACCEPT_NONE;
  bool targeted_search = false;

  // Aperture representation local search
  bool search_aperture = false;
  bool search_intensity = false;
  double prob_intensity = 0.2;
  int perturbation = 2;
  double temperature;
  double initial_temperature = 10;
  double min_temperature = 0;
  double alphaT = 0.95;


  string file="data/testinstance_0_70_140_210_280.txt";
  string file2="data/test_instance_coordinates.txt";
  char* file3=NULL;

  string path=".";

  // Tabu list <<beam,station*>, open> for intensity
  vector<pair<pair<int,Station*>,  bool > > tabu_list_inten;
  // Tabu list <<beam,station*>, <aperture,open>> for aperture
  vector<pair<pair<int,Station*>, pair<int, bool> > > tabu_list_aper;
  int tabusize=10;


	args::ArgumentParser parser("********* IMRT-Solver (Aperture solver) *********",
                             "Example.\n./AS -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt");
	args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
	//args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
  args::ValueFlag<string> _strategy (parser, "string", "Strategy  (dao_ls|ibo_ls)", {'s', "strategy"});

  args::ValueFlag<int> _bsize(parser, "int", "Number of considered beamlets for selection ("+to_string(bsize)+")", {"bsize"});
	args::ValueFlag<int> _vsize(parser, "int", "Number of considered worst voxels ("+to_string(vsize)+")", {"vsize"});
 // args::ValueFlag<int> _int0(parser, "int", "Initial intensity for beams  ("+to_string(int0)+")", {"int0"});
  args::ValueFlag<int> _maxdelta(parser, "int", "Max delta  ("+to_string(maxdelta)+")", {"maxdelta"});
  args::ValueFlag<int> _maxratio(parser, "int", "Max ratio  ("+to_string(maxratio)+")", {"maxratio"});

  args::ValueFlag<int> _maxiter(parser, "int", "Number of iterations ("+to_string(maxiter)+")", {"maxiter"});
  args::ValueFlag<int> _maxtime(parser, "int", "Maximum time in seconds ("+to_string(maxtime)+")", {"maxtime"});
  args::ValueFlag<int> _seed(parser, "int", "Seed  ("+to_string(seed)+")", {"seed"});

  args::ValueFlag<double> _alpha(parser, "double", "Initial temperature for intensities  ("+to_string(alpha)+")", {"alpha"});
  args::ValueFlag<double> _beta(parser, "double", "Initial temperature for ratio  ("+to_string(beta)+")", {"beta"});

  args::Group setup (parser, "Initial solution setup (these override all provided configurations):", args::Group::Validators::DontCare);
  args::Flag open_max(setup, "open_max", "Open aperture setup with max intensity", {"open-max-setup"});
  args::Flag open_min(setup, "open_min", "Open aperture setup with min intensity", {"open-min-setup"});
  args::Flag closed_min(setup, "closed_min", "Closed aperture setup with min intensity", {"closed-min-setup"});
  args::Flag closed_max(setup, "closed_max", "Closed aperture setup with max intensity", {"closed-max-setup"});
  args::Flag all_rand(setup, "all_rand", "Random aperture setup with random intensity", {"rand-setup"});

  args::ValueFlag<int> _max_apertures(parser, "int", "Initial intensity for the station  ("+to_string(max_apertures)+")", {"max-apertures"});
  args::ValueFlag<int> _open_apertures(parser, "int", "Number of initialized open apertures (-1: all, default:"+to_string(open_apertures)+")", {"open-apertures"});
  args::ValueFlag<int> _initial_intensity(parser, "int", "Initial value aperture intensity  ("+to_string(initial_intensity)+")", {"initial-intensity"});
  args::ValueFlag<int> _max_intensity(parser, "int", "Max value aperture intensity  ("+to_string(max_intensity)+")", {"max-intensity"});
  args::ValueFlag<int> _step_intensity(parser, "int", "Step size for aperture intensity  ("+to_string(step_intensity)+")", {"step-intensity"});

  args::Group dao_ls (parser, "Direct aperture local search:", args::Group::Validators::DontCare);
  args::Flag _targeted_search(dao_ls, "targeted_search", "Apply targeted local search", {"targeted"});
  args::Flag ls_aperture(dao_ls, "ls_apertures", "Apply aperture local search", {"ls-aperture"});
  args::Flag ls_intensity(dao_ls, "ls_intensity", "Apply intensity local search", {"ls-intensity"});
  args::ValueFlag<double> _prob_intensity(dao_ls, "double", "Probability to search over intensity  ("+to_string(prob_intensity)+")", {"prob-intensity"});
  args::Flag best_improv(dao_ls, "best_improv", "Apply best improvement when searching intensity or apertures", {"best-improvement"});
  args::Flag first_improv(dao_ls, "first_improv", "Apply first improvement when searching intensity or apertures", {"first-improvement"});
  args::Flag do_perturbate(dao_ls, "do_perturbate", "Perturbate after a selected criterion is triggered", {"perturbate"});
  args::ValueFlag<int> _perturbation(parser, "int", "Perturbation size  ("+to_string(perturbation)+")", {"perturbation-size"});

  args::Group accept (parser, "Acceptance criterion:", args::Group::Validators::AtMostOne);
  args::Flag accept_best(accept, "accept-best", "Accept only improvement", {"accept-best"});
  args::Flag accept_sa(accept, "accept-sa", "Accept as simulated annealing", {"accept-sa"});

  args::ValueFlag<double> _temperature(parser, "double", "Temperature for acceptance criterion  ("+to_string(temperature)+")", {"temperature"});
  args::ValueFlag<double> _alphaT(parser, "double", "Reduction rate of the temperature  ("+to_string(alphaT)+")", {"alphaT"});

	//args::Flag trace(parser, "trace", "Trace", {"trace"});
  args::ValueFlag<string> _file(parser, "string", "File with the deposition matrix", {"file-dep"});
  args::ValueFlag<string> _file2(parser, "string", "File with the beam coordinates", {"file-coord"});
  args::ValueFlag<string> _file3(parser, "string", "File with initial intensities", {"file-sol"});
  args::ValueFlag<string> _path(parser, "string", "Absolute path of the executable (if it is executed from other directory)", {"path"});
  args::Flag _plot(parser, "bool", "Generate plot and save in file", {"plot"});

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

	if(_strategy) strategy=_strategy.Get();

	if(_bsize) bsize=_bsize.Get();
	if(_vsize) vsize=_vsize.Get();
	if(_maxdelta) maxdelta=_maxdelta.Get();
	if(_maxratio) maxratio=_maxratio.Get();

	if(_maxiter) maxiter=_maxiter.Get();
	if(_maxtime) maxtime=_maxtime.Get();
	if(_seed) seed=_seed.Get();

	if(_alpha) alpha=_alpha.Get();
	if(_beta) beta=_beta.Get();

  if(_max_apertures) max_apertures=_max_apertures.Get();
  if(_open_apertures) open_apertures=_open_apertures.Get();

  if(_initial_intensity) initial_intensity=_initial_intensity.Get();
  if(_max_intensity) max_intensity=_max_intensity.Get();
  if(_step_intensity) step_intensity=_step_intensity.Get();
  if(_prob_intensity) prob_intensity=_prob_intensity.Get();

  if (_targeted_search) targeted_search = true;
  if (ls_aperture) search_aperture = true;
  if (ls_intensity) search_intensity = true;
  if(!ls_aperture && !ls_intensity){
    search_aperture=true;
    search_intensity=true;
  }
  if (_perturbation) perturbation=_perturbation.Get();

  if (first_improv) ls_type=ApertureILS::FIRST_IMPROVEMENT;
  if (best_improv) ls_type=ApertureILS::BEST_IMPROVEMENT;
  if (accept_sa) acceptance=ILS::ACCEPT_SA;
  if (accept_best) acceptance=ILS::ACCEPT_NONE;

  if(_temperature) temperature=initial_temperature=_temperature.Get();
  if(_alphaT) alphaT=_alphaT.Get();

  //This should be at the end given that will modify values
  if(open_max) {
    initial_setup=Station::OPEN_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (open_min) {
    initial_setup=Station::OPEN_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_min) {
    initial_setup=Station::CLOSED_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_max) {
    initial_setup=Station::CLOSED_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (all_rand) {
    if(strategy=="dao_ls")
      initial_setup=Station::RAND_RAND_SETUP;
    else if (strategy=="ibo_ls")
      initial_setup=Station::RAND_INTENSITIES;
  } else {
    initial_setup=Station::MANUAL_SETUP;
  }

  srand(seed);
  if (_file) file=_file.Get();
  if (_file2) file2=_file2.Get();
  if (_file3) file3=strdup(_file3.Get().c_str()); //intensidades de partida
  if (_path) path=_path.Get();

  chdir(path.c_str());

  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  if(strategy=="dao_ls") {
    cout << "##******** IMRT-Solver (Direct Aperture Optimization Local Search) *********"<< endl;
  } else if(strategy=="ibo_ls") {
    cout << "##******** IMRT-Solver (Intensity-based Optimization Local Search) *********"<< endl;
  }
  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;

  vector<double> w={1,1,1};
  vector<double> Zmin={0,0,76};
  vector<double> Zmax={65,60,1000};

  Collimator collimator(file2, get_angles(file, 5));
  vector<Volume> volumes= createVolumes (file, collimator);

  Plan P(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity, open_apertures, initial_setup,file3);

  double best_eval=P.getEvaluation();

  cout << "##" << endl << "##**************************************************************************"<< endl;
  cout << "##*********************************** INFO *********************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##" << endl << "## Solver: "<< endl;
  cout << "##   Iterations: " << maxiter << endl;
  cout << "##   Time: " << maxtime << endl;
  cout << "##   Seed: " << seed << endl;
  cout << "##   Temperature: " << temperature << endl;
  cout << "##   alpha: " << alpha << endl;
  if (search_aperture)
    cout << "##   Searching: aperture pattern" << endl;
  if (search_intensity)
    cout << "##   Searching: intensity" << endl;
  cout << "##   Probability intensity ls: " << prob_intensity << endl;
  if (strategy=="dao_ls" && ls_type==ApertureILS::FIRST_IMPROVEMENT)
    cout << "##   Local search: first improvement"  << endl;
  if (strategy=="dao_ls" && ls_type==ApertureILS::BEST_IMPROVEMENT)
    cout << "##   Local search: best improvement"  << endl;
  if (strategy=="dao_ls" && targeted_search)
    cout << "##   Targeted search: yes"  << endl;
  if (strategy=="dao_ls" && !targeted_search)
    cout << "##   Targeted search: no"  << endl;

  cout << "##   Open initial setup: " ;
  if (initial_setup==Station::OPEN_MAX_SETUP) cout << "open max intensity" << endl;
  else if (initial_setup==Station::OPEN_MIN_SETUP) cout << "open min intensity" << endl;
  else if (initial_setup==Station::CLOSED_MAX_SETUP) cout << "closed max intensity" << endl;
  else if (initial_setup==Station::CLOSED_MIN_SETUP) cout << "closed min intensity" << endl;
  else if (initial_setup==Station::RAND_RAND_SETUP) cout << "random" << endl;
  else if (initial_setup==Station::RAND_INTENSITIES) cout << "random" << endl;
  else cout << "manual, " << open_apertures << " open apertures" << endl;
  cout << "##   Initial intensity: " << initial_intensity << endl;
  cout << "##   Max intensity: " << max_intensity << endl;
  cout << "##   Step intensity: " << step_intensity << endl;
  cout << "##   Perturbation size: " << perturbation << endl;
  cout << "##" << endl << "## Colimator configuration: "<< endl;
  cout << "##   Stations: " << collimator.getNbAngles() << endl;
  cout << "##   Angles: ";
  for (int i=0; i<collimator.getNbAngles();i++) cout << collimator.getAngle(i) << " ";
  cout << endl;
  cout << "##   Apertures: " << max_apertures << endl;


  cout << "##" << endl << "## Instance information: "<< endl;
  cout << "##   Volumes: " << volumes.size() << endl;

  cout << "##" << endl << "##**************************************************************************"<< endl;
  cout << "##********************************** SEARCH ********************************"<< endl;
  cout << "##**************************************************************************"<< endl;



  cout << "## Initial solution: " << best_eval << endl;
  cout  << "##" << endl;
  
  cout << endl;
  for(int i=0;i<5;i++)
    P.printIntensity(i);
  cout << endl;

  ILS* ils;
  if(strategy=="dao_ls"){
    ils = new ApertureILS(bsize, vsize, search_intensity, search_aperture,
                          prob_intensity, step_intensity, initial_temperature,
                          alphaT, do_perturbate, perturbation, acceptance, ls_type);
   /* if (!targeted_search)*/
      ils-> notTargetedSearch(P, maxtime, maxiter);
    /*else
      ils-> beamTargetedSearch(P, maxtime, maxiter);*/
  }else if(strategy=="ibo_ls"){
/*
	    for(auto s:P.get_stations()){
	      for (int i=0; i<collimator.getXdim();i++) {
				  for (int j=0; j<collimator.getYdim(); j++) {
	          if(s->I(i,j)!=-1){
	        	  pair<double, double> vc=EvaluationFunction::getInstance().get_value_cost(
	        	              		s->getAngle(), s->pos2beam[make_pair(i,j)], Zmin, Zmax);
	            printf("%5.1f ",
	            vc.first);
	          }else cout << "   -1 " ;
	        }
	        cout << endl;
	      }
	      cout << endl;
	    }

	    for(auto s:P.get_stations()){
	      for (int i=0; i<collimator.getXdim();i++) {
				  for (int j=0; j<collimator.getYdim(); j++) {
	          if(s->I(i,j)!=-1){
	        	  pair<double, double> vc=EvaluationFunction::getInstance().get_value_cost(
	        	              		s->getAngle(), s->pos2beam[make_pair(i,j)], Zmin, Zmax);
	            printf("%6.1f ",
	            1/vc.second);
	          }else cout << "    -1 " ;
	        }
	        cout << endl;
	      }
	      cout << endl;
	    }
*/

    ils = new IntensityILS(step_intensity, bsize, vsize, maxdelta, maxratio, alpha, beta, perturbation);
    ils->beamTargetedSearch(P, maxtime, maxiter);


    
    cout << endl;
  	for(int i=0;i<5;i++)
  		P.printIntensity(i);
  	cout << endl;



    for(int i=0;i<50;i++) cout << ils->iLocalSearch(P, false) << endl;
    cout << P.eval() << endl  ;
  }else if(strategy=="intgen"){
	  IntensityGenerator intgen;
	  intgen.generate(P);
  }




  cout << "##**************************************************************************"<< endl;
  cout << "##******************************* RESULTS **********************************"<< endl;
  cout << "##**************************************************************************"<< endl;



  cout << "##"<<endl;
  cout << "## Best solution found: " <<  P.getEvaluation() << endl;

  cout <<  P.getEvaluation() << " ";

  const list<Station*> stations=P.get_stations();

  int tot_alpha=0;
  for(auto s:stations){
    int alpha=s->get_sum_alpha(strategy);
    cout << alpha << " " ;
    tot_alpha+=alpha;
  }
  cout << tot_alpha << " ";

  int nb_apertures=0;
  for(auto s:stations){
    int ap=s->get_nb_apertures(strategy);
    cout << ap << " " ;
    nb_apertures+=ap;
  }
  cout << nb_apertures << endl;


	cout << endl;
	for(int i=0;i<5;i++)
		P.printIntensity(i);

	cout << endl;

	/*cout << "********   Summary of the results    *********"<< endl;
	best_eval = F.eval(P,w,Zmin,Zmax);
	cout << "Final solution: " << best_eval << endl << endl;

  F.generate_voxel_dose_functions ();*/

  set<int> l = get_angles(file, 5);
  if(_plot){
	  std::stringstream ss;
	  ss << "python plotter/plot.py " << *l.begin()/5 << "_" << strategy << "_" << initial_intensity << "_" << initial_setup << "_" << maxtime << "_" << seed <<".pdf";
	  std::string s = ss.str();
	  system(s.c_str());
  }

	return 0;

}